

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O2

uint64_t SharpYuvUpdateY_SSE2(uint16_t *ref,uint16_t *src,uint16_t *dst,int len,int bit_depth)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  short sVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  uint uVar7;
  uint16_t uVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  short sVar16;
  ushort uVar17;
  short sVar18;
  ushort uVar19;
  short sVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  short sVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar27;
  short sVar28;
  ushort uVar29;
  short sVar30;
  ushort uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  auVar5 = _DAT_00182cb0;
  uVar10 = ~(-1 << ((byte)bit_depth & 0x1f));
  auVar11 = pshuflw(ZEXT416(uVar10),ZEXT416(uVar10),0);
  iVar12 = 0;
  iVar13 = 0;
  iVar14 = 0;
  iVar15 = 0;
  lVar9 = 0;
  while (lVar9 + 8 <= (long)len) {
    puVar1 = ref + lVar9;
    puVar2 = src + lVar9;
    auVar33._0_2_ = *puVar1 - *puVar2;
    auVar33._2_2_ = puVar1[1] - puVar2[1];
    auVar33._4_2_ = puVar1[2] - puVar2[2];
    auVar33._6_2_ = puVar1[3] - puVar2[3];
    auVar33._8_2_ = puVar1[4] - puVar2[4];
    auVar33._10_2_ = puVar1[5] - puVar2[5];
    auVar33._12_2_ = puVar1[6] - puVar2[6];
    auVar33._14_2_ = puVar1[7] - puVar2[7];
    puVar1 = dst + lVar9;
    auVar32 = psraw(auVar33,0xf);
    sVar16 = *puVar1 + auVar33._0_2_;
    sVar18 = puVar1[1] + auVar33._2_2_;
    sVar20 = puVar1[2] + auVar33._4_2_;
    sVar22 = puVar1[3] + auVar33._6_2_;
    sVar24 = puVar1[4] + auVar33._8_2_;
    sVar26 = puVar1[5] + auVar33._10_2_;
    sVar28 = puVar1[6] + auVar33._12_2_;
    sVar30 = puVar1[7] + auVar33._14_2_;
    sVar3 = auVar11._0_2_;
    uVar17 = (ushort)(sVar3 < sVar16) * sVar3 | (ushort)(sVar3 >= sVar16) * sVar16;
    sVar16 = auVar11._2_2_;
    uVar19 = (ushort)(sVar16 < sVar18) * sVar16 | (ushort)(sVar16 >= sVar18) * sVar18;
    uVar21 = (ushort)(sVar3 < sVar20) * sVar3 | (ushort)(sVar3 >= sVar20) * sVar20;
    uVar23 = (ushort)(sVar16 < sVar22) * sVar16 | (ushort)(sVar16 >= sVar22) * sVar22;
    uVar25 = (ushort)(sVar3 < sVar24) * sVar3 | (ushort)(sVar3 >= sVar24) * sVar24;
    uVar27 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
    uVar29 = (ushort)(sVar3 < sVar28) * sVar3 | (ushort)(sVar3 >= sVar28) * sVar28;
    uVar31 = (ushort)(sVar16 < sVar30) * sVar16 | (ushort)(sVar16 >= sVar30) * sVar30;
    auVar33 = pmaddwd(auVar32 | auVar5,auVar33);
    puVar1 = dst + lVar9;
    *puVar1 = (-1 < (short)uVar17) * uVar17;
    puVar1[1] = (-1 < (short)uVar19) * uVar19;
    puVar1[2] = (-1 < (short)uVar21) * uVar21;
    puVar1[3] = (-1 < (short)uVar23) * uVar23;
    puVar1[4] = (-1 < (short)uVar25) * uVar25;
    puVar1[5] = (-1 < (short)uVar27) * uVar27;
    puVar1[6] = (-1 < (short)uVar29) * uVar29;
    puVar1[7] = (-1 < (short)uVar31) * uVar31;
    iVar12 = iVar12 + auVar33._0_4_;
    iVar13 = iVar13 + auVar33._4_4_;
    iVar14 = iVar14 + auVar33._8_4_;
    iVar15 = iVar15 + auVar33._12_4_;
    lVar9 = lVar9 + 8;
  }
  uVar6 = (ulong)(uint)(iVar15 + iVar13 + iVar14 + iVar12);
  for (; lVar9 < len; lVar9 = lVar9 + 1) {
    iVar12 = (uint)ref[lVar9] - (uint)src[lVar9];
    uVar7 = (uint)dst[lVar9] + iVar12;
    uVar4 = uVar10;
    if ((int)uVar7 < (int)uVar10) {
      uVar4 = uVar7;
    }
    uVar8 = (uint16_t)uVar4;
    if ((int)uVar7 < 0) {
      uVar8 = 0;
    }
    iVar13 = -iVar12;
    if (0 < iVar12) {
      iVar13 = iVar12;
    }
    dst[lVar9] = uVar8;
    uVar6 = uVar6 + (ushort)iVar13;
  }
  return uVar6;
}

Assistant:

static uint64_t SharpYuvUpdateY_SSE2(const uint16_t* ref, const uint16_t* src,
                                     uint16_t* dst, int len, int bit_depth) {
  const int max_y = (1 << bit_depth) - 1;
  uint64_t diff = 0;
  uint32_t tmp[4];
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i max = _mm_set1_epi16(max_y);
  const __m128i one = _mm_set1_epi16(1);
  __m128i sum = zero;

  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);       // diff_y
    const __m128i E = _mm_cmpgt_epi16(zero, D);  // sign (-1 or 0)
    const __m128i F = _mm_add_epi16(C, D);       // new_y
    const __m128i G = _mm_or_si128(E, one);      // -1 or 1
    const __m128i H = _mm_max_epi16(_mm_min_epi16(F, max), zero);
    const __m128i I = _mm_madd_epi16(D, G);      // sum(abs(...))
    _mm_storeu_si128((__m128i*)(dst + i), H);
    sum = _mm_add_epi32(sum, I);
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  diff = tmp[3] + tmp[2] + tmp[1] + tmp[0];
  for (; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_SSE2(new_y, max_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}